

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  _func_int *p_Var4;
  int *piVar5;
  Layer *pLVar6;
  _func_int **pp_Var7;
  void *pvVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar12;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  Mat *pMVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  Option *_elemsize;
  void *pvVar33;
  uint _w;
  int iVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  Option *opt_00;
  long lVar38;
  uint _elempack;
  ulong uVar39;
  bool bVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  v4sf one;
  float fVar44;
  float fVar45;
  float fVar52;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  uint local_268;
  Mat local_238;
  Mat *local_1e8;
  ulong local_1e0;
  Mat local_1d8;
  Mat local_188;
  ulong local_138;
  ulong local_130;
  long local_128;
  int local_11c;
  void *local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  int local_100;
  Allocator *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  int local_e0;
  ulong local_d8;
  pointer local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  ulong local_88;
  undefined4 local_78;
  int iStack_74;
  Allocator *pAStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uVar14;
  undefined3 uVar16;
  undefined2 uVar18;
  
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) != 0)) {
    iVar25 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar25;
  }
  local_130 = (ulong)(uint)bottom_blob->c;
  uVar39 = bottom_blob->elemsize;
  iVar25 = bottom_blob->elempack;
  p_Var4 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar37 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  iVar26 = *(int *)(&this->field_0xdc + (long)p_Var4);
  iVar31 = *(int *)(&this->field_0xe0 + (long)p_Var4);
  local_1d8.cstep = 0;
  local_1d8.data = (void *)0x0;
  local_1d8.refcount._0_4_ = 0;
  local_1d8.refcount._4_4_ = 0;
  local_1d8.elemsize._0_4_ = 0;
  local_1d8.elemsize._4_4_ = 0;
  local_1d8.elempack = 0;
  local_1d8.allocator = (Allocator *)0x0;
  local_1d8.dims = 0;
  local_1d8.w = 0;
  local_1d8.h = 0;
  local_1d8.d = 0;
  local_1d8.c = 0;
  local_1e8 = top_blob;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86 +
             (long)this->_vptr_ConvolutionDepthWise_x86[-3]),bottom_blob,&local_1d8,opt);
  iVar24 = local_1d8.w;
  pMVar20 = local_1e8;
  iVar34 = -100;
  if ((local_1d8.data == (void *)0x0) || ((long)local_1d8.c * local_1d8.cstep == 0))
  goto LAB_00437f67;
  p_Var4 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar29 = (~((iVar29 + -1) * iVar26) + local_1d8.w) / *(int *)(&this->field_0xe4 + (long)p_Var4);
  _w = iVar29 + 1;
  uVar32 = (long)(~((iVar37 + -1) * iVar31) + local_1d8.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var4);
  local_1e0 = uVar32 & 0xffffffff;
  iVar37 = (int)uVar32 + 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    _elempack = (uint)(((&this->field_0xd0)[(long)p_Var4] & 3) == 0) * 3 + 1;
  }
  _elemsize = (Option *)((uVar39 / (ulong)(long)iVar25) * (ulong)_elempack);
  local_128 = CONCAT44(local_128._4_4_,iVar37);
  opt_00 = _elemsize;
  Mat::create(local_1e8,_w,iVar37,*(int *)(&this->field_0xd0 + (long)p_Var4) / (int)_elempack,
              (size_t)_elemsize,_elempack,opt->blob_allocator);
  iVar34 = -100;
  if ((pMVar20->data == (void *)0x0) || ((long)pMVar20->c * pMVar20->cstep == 0)) goto LAB_00437f67;
  iVar26 = (int)local_130 * iVar25;
  p_Var4 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar37 = *(int *)(&this->field_0x108 + (long)p_Var4);
  if ((iVar26 == iVar37) && (iVar37 == *(int *)(&this->field_0xd0 + (long)p_Var4))) {
    if (iVar25 == 1) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var4) == 3) {
        if ((((*(int *)(&this->field_0xd8 + (long)p_Var4) == 3) &&
             (*(int *)(&this->field_0xdc + (long)p_Var4) == 1)) &&
            (*(int *)(&this->field_0xe0 + (long)p_Var4) == 1)) &&
           ((*(int *)(&this->field_0xe4 + (long)p_Var4) == 1 &&
            (*(int *)(&this->field_0xe8 + (long)p_Var4) == 1)))) {
          convdw3x3s1_sse(&local_1d8,pMVar20,&this->weight_data_tm,
                          (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
        }
        else {
          if ((((*(int *)(&this->field_0xd8 + (long)p_Var4) != 3) ||
               ((*(int *)(&this->field_0xdc + (long)p_Var4) != 1 ||
                (*(int *)(&this->field_0xe0 + (long)p_Var4) != 1)))) ||
              (*(int *)(&this->field_0xe4 + (long)p_Var4) != 2)) ||
             (*(int *)(&this->field_0xe8 + (long)p_Var4) != 2)) goto LAB_0043717f;
          convdw3x3s2_sse(&local_1d8,pMVar20,&this->weight_data_tm,
                          (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
        }
        goto LAB_00437786;
      }
    }
    else if (iVar25 == 4) {
      iVar25 = *(int *)(&this->field_0xd4 + (long)p_Var4);
      if ((long)iVar25 == 3) {
        if ((((*(int *)(&this->field_0xd8 + (long)p_Var4) == 3) &&
             (*(int *)(&this->field_0xdc + (long)p_Var4) == 1)) &&
            (*(int *)(&this->field_0xe0 + (long)p_Var4) == 1)) &&
           ((*(int *)(&this->field_0xe4 + (long)p_Var4) == 1 &&
            (*(int *)(&this->field_0xe8 + (long)p_Var4) == 1)))) {
          convdw3x3s1_pack4_sse
                    (&local_1d8,pMVar20,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
        }
        else {
          if (((iVar25 != 3) ||
              ((*(int *)(&this->field_0xd8 + (long)p_Var4) != 3 ||
               (*(int *)(&this->field_0xdc + (long)p_Var4) != 1)))) ||
             ((*(int *)(&this->field_0xe0 + (long)p_Var4) != 1 ||
              ((*(int *)(&this->field_0xe4 + (long)p_Var4) != 2 ||
               (*(int *)(&this->field_0xe8 + (long)p_Var4) != 2)))))) goto LAB_004370c3;
          convdw3x3s2_pack4_sse
                    (&local_1d8,pMVar20,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
        }
LAB_00437786:
        pLVar6 = this->activation;
        if (pLVar6 != (Layer *)0x0) {
          (*pLVar6->_vptr_Layer[9])(pLVar6,pMVar20,opt);
        }
      }
      else {
LAB_004370c3:
        if (iVar25 == 5) {
          if ((((*(int *)(&this->field_0xd8 + (long)p_Var4) == 5) &&
               (*(int *)(&this->field_0xdc + (long)p_Var4) == 1)) &&
              (*(int *)(&this->field_0xe0 + (long)p_Var4) == 1)) &&
             ((*(int *)(&this->field_0xe4 + (long)p_Var4) == 1 &&
              (*(int *)(&this->field_0xe8 + (long)p_Var4) == 1)))) {
            convdw5x5s1_pack4_sse
                      (&local_1d8,pMVar20,&this->weight_data_tm,
                       (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
          }
          else {
            if (((*(int *)(&this->field_0xd8 + (long)p_Var4) != 5) ||
                ((*(int *)(&this->field_0xdc + (long)p_Var4) != 1 ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var4) != 1)))) ||
               ((*(int *)(&this->field_0xe4 + (long)p_Var4) != 2 ||
                (*(int *)(&this->field_0xe8 + (long)p_Var4) != 2)))) goto LAB_004377a4;
            convdw5x5s2_pack4_sse
                      (&local_1d8,pMVar20,&this->weight_data_tm,
                       (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
          }
          goto LAB_00437786;
        }
LAB_004377a4:
        uVar39 = (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * (long)iVar25;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_188,uVar39,
                   (allocator_type *)&local_238);
        pp_Var7 = this->_vptr_ConvolutionDepthWise_x86;
        p_Var4 = pp_Var7[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var4)) {
          iVar25 = *(int *)(&this->field_0xe0 + (long)p_Var4);
          iVar37 = *(int *)(&this->field_0xdc + (long)p_Var4);
          iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var4);
          iVar31 = 0;
          iVar34 = 0;
          iVar36 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var7[-3])) {
              lVar38 = 0;
              do {
                *(int *)((long)local_188.data + (iVar34 + lVar38) * 4) = iVar36;
                iVar36 = iVar36 + *(int *)(&this->field_0xdc + (long)pp_Var7[-3]);
                lVar38 = lVar38 + 1;
              } while ((int)lVar38 < *(int *)(&this->field_0xd4 + (long)pp_Var7[-3]));
              iVar34 = iVar34 + (int)lVar38;
            }
            iVar36 = iVar36 + (iVar24 * iVar25 - iVar37 * iVar26);
            iVar31 = iVar31 + 1;
          } while (iVar31 < *(int *)(&this->field_0xd8 + (long)pp_Var7[-3]));
        }
        auVar23 = _DAT_0054e260;
        auVar22 = _DAT_0054e230;
        auVar21 = _DAT_0054e220;
        if (0 < (int)local_130) {
          local_11c = (int)uVar39 * 4;
          local_128 = (long)(int)(_w * 4);
          iVar25 = 0;
          fVar41 = (float)DAT_0054e260;
          fVar42 = DAT_0054e260._4_4_;
          fVar43 = DAT_0054e260._8_4_;
          fVar44 = DAT_0054e260._12_4_;
          local_138 = 0;
          do {
            if (-1 < (int)local_1e0) {
              pvVar33 = (void *)(local_1e8->cstep * local_138 * local_1e8->elemsize +
                                (long)local_1e8->data);
              pp_Var7 = this->_vptr_ConvolutionDepthWise_x86;
              pvVar8 = (this->weight_data_tm).data;
              iVar37 = 0;
              do {
                if (-1 < iVar29) {
                  uVar32 = 0;
                  do {
                    p_Var4 = pp_Var7[-3];
                    if (*(int *)(&this->field_0x100 + (long)p_Var4) == 0) {
                      auVar50 = ZEXT816(0);
                    }
                    else {
                      auVar50 = *(undefined1 (*) [16])
                                 (*(long *)(&this->field_0x1b0 + (long)p_Var4) + local_138 * 0x10);
                    }
                    if (0 < (int)uVar39) {
                      lVar38 = 0;
                      auVar51 = auVar50;
                      do {
                        auVar54 = *(undefined1 (*) [16])
                                   ((long)local_1d8.data +
                                   (long)*(int *)((long)local_188.data + lVar38) * 0x10 +
                                   (long)(*(int *)(&this->field_0xe4 + (long)p_Var4) * (int)uVar32 *
                                         4) * 4 +
                                   (long)*(int *)(&this->field_0xe8 + (long)p_Var4) * (long)iVar37 *
                                   (long)local_1d8.w *
                                   CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize)
                                   + local_1d8.cstep * local_138 *
                                     CONCAT44(local_1d8.elemsize._4_4_,
                                              (undefined4)local_1d8.elemsize));
                        pfVar1 = (float *)((long)pvVar8 + lVar38 * 4 + (long)iVar25 * 4);
                        auVar50._0_4_ = auVar51._0_4_ + *pfVar1 * auVar54._0_4_;
                        auVar50._4_4_ = auVar51._4_4_ + pfVar1[1] * auVar54._4_4_;
                        auVar50._8_4_ = auVar51._8_4_ + pfVar1[2] * auVar54._8_4_;
                        auVar50._12_4_ = auVar51._12_4_ + pfVar1[3] * auVar54._12_4_;
                        lVar38 = lVar38 + 4;
                        auVar51 = auVar50;
                      } while ((uVar39 & 0xffffffff) << 2 != lVar38);
                    }
                    fVar45 = auVar50._0_4_;
                    fVar56 = auVar50._4_4_;
                    fVar52 = auVar50._8_4_;
                    fVar58 = auVar50._12_4_;
                    switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var4)) {
                    case 1:
                      auVar50 = maxps(auVar50,ZEXT816(0));
                      break;
                    case 2:
                      auVar51 = maxps(auVar50,ZEXT816(0));
                      auVar54 = minps(auVar50,ZEXT816(0));
                      fVar45 = **(float **)(&this->field_0x118 + (long)p_Var4);
                      auVar50._4_4_ = fVar45 * auVar54._4_4_ + auVar51._4_4_;
                      auVar50._0_4_ = fVar45 * auVar54._0_4_ + auVar51._0_4_;
                      auVar50._8_4_ = fVar45 * auVar54._8_4_ + auVar51._8_4_;
                      auVar50._12_4_ = fVar45 * auVar54._12_4_ + auVar51._12_4_;
                      break;
                    case 3:
                      uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var4);
                      uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var4))[1];
                      auVar48._4_4_ = uVar2;
                      auVar48._0_4_ = uVar2;
                      auVar48._8_4_ = uVar2;
                      auVar48._12_4_ = uVar2;
                      auVar50 = maxps(auVar50,auVar48);
                      auVar10._4_4_ = uVar3;
                      auVar10._0_4_ = uVar3;
                      auVar10._8_4_ = uVar3;
                      auVar10._12_4_ = uVar3;
                      auVar50 = minps(auVar50,auVar10);
                      break;
                    case 4:
                      auVar53._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
                      auVar53._8_4_ = -fVar52;
                      auVar53._12_4_ = -fVar58;
                      auVar50 = minps(auVar53,auVar21);
                      auVar50 = maxps(auVar50,auVar22);
                      fVar56 = auVar50._0_4_ * 1.442695 + 0.5;
                      fVar58 = auVar50._4_4_ * 1.442695 + 0.5;
                      fVar62 = auVar50._8_4_ * 1.442695 + 0.5;
                      fVar64 = auVar50._12_4_ * 1.442695 + 0.5;
                      fVar45 = (float)(int)fVar56;
                      fVar52 = (float)(int)fVar58;
                      fVar61 = (float)(int)fVar62;
                      fVar63 = (float)(int)fVar64;
                      fVar45 = fVar45 - (float)(-(uint)(fVar56 < fVar45) & (uint)fVar41);
                      fVar52 = fVar52 - (float)(-(uint)(fVar58 < fVar52) & (uint)fVar42);
                      fVar61 = fVar61 - (float)(-(uint)(fVar62 < fVar61) & (uint)fVar43);
                      fVar63 = fVar63 - (float)(-(uint)(fVar64 < fVar63) & (uint)fVar44);
                      fVar56 = fVar45 * -0.6931472 + auVar50._0_4_;
                      fVar58 = fVar52 * -0.6931472 + auVar50._4_4_;
                      fVar62 = fVar61 * -0.6931472 + auVar50._8_4_;
                      fVar64 = fVar63 * -0.6931472 + auVar50._12_4_;
                      auVar49._0_4_ =
                           fVar56 + fVar41 +
                           (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) *
                              fVar56 + 0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5) *
                           fVar56 * fVar56;
                      auVar49._4_4_ =
                           fVar58 + fVar42 +
                           (((((fVar58 * 0.00019875691 + 0.0013981999) * fVar58 + 0.008333452) *
                              fVar58 + 0.041665796) * fVar58 + 0.16666666) * fVar58 + 0.5) *
                           fVar58 * fVar58;
                      auVar49._8_4_ =
                           fVar62 + fVar43 +
                           (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) *
                              fVar62 + 0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) *
                           fVar62 * fVar62;
                      auVar49._12_4_ =
                           fVar64 + fVar44 +
                           (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) *
                              fVar64 + 0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) *
                           fVar64 * fVar64;
                      fVar62 = (float)((int)fVar45 * 0x800000 + (int)fVar41) * auVar49._0_4_ +
                               fVar41;
                      fVar64 = (float)((int)fVar52 * 0x800000 + (int)fVar42) * auVar49._4_4_ +
                               fVar42;
                      fVar61 = (float)((int)fVar61 * 0x800000 + (int)fVar43) * auVar49._8_4_ +
                               fVar43;
                      fVar63 = (float)((int)fVar63 * 0x800000 + (int)fVar44) * auVar49._12_4_ +
                               fVar44;
                      auVar9._4_4_ = fVar64;
                      auVar9._0_4_ = fVar62;
                      auVar9._8_4_ = fVar61;
                      auVar9._12_4_ = fVar63;
                      auVar50 = rcpps(auVar49,auVar9);
                      fVar45 = auVar50._0_4_;
                      fVar56 = auVar50._4_4_;
                      fVar52 = auVar50._8_4_;
                      fVar58 = auVar50._12_4_;
                      auVar50._0_4_ = (fVar41 - fVar62 * fVar45) * fVar45 + fVar45;
                      auVar50._4_4_ = (fVar42 - fVar64 * fVar56) * fVar56 + fVar56;
                      auVar50._8_4_ = (fVar43 - fVar61 * fVar52) * fVar52 + fVar52;
                      auVar50._12_4_ = (fVar44 - fVar63 * fVar58) * fVar58 + fVar58;
                      break;
                    case 5:
                      auVar50 = minps(auVar50,auVar21);
                      auVar50 = maxps(auVar50,auVar22);
                      fVar61 = auVar50._0_4_ * 1.442695 + 0.5;
                      fVar62 = auVar50._4_4_ * 1.442695 + 0.5;
                      fVar63 = auVar50._8_4_ * 1.442695 + 0.5;
                      fVar64 = auVar50._12_4_ * 1.442695 + 0.5;
                      fVar55 = (float)(int)fVar61;
                      fVar57 = (float)(int)fVar62;
                      fVar59 = (float)(int)fVar63;
                      fVar60 = (float)(int)fVar64;
                      fVar55 = fVar55 - (float)(-(uint)(fVar61 < fVar55) & (uint)fVar41);
                      fVar57 = fVar57 - (float)(-(uint)(fVar62 < fVar57) & (uint)fVar42);
                      fVar59 = fVar59 - (float)(-(uint)(fVar63 < fVar59) & (uint)fVar43);
                      fVar60 = fVar60 - (float)(-(uint)(fVar64 < fVar60) & (uint)fVar44);
                      fVar61 = auVar50._0_4_ - fVar55 * 0.6931472;
                      fVar62 = auVar50._4_4_ - fVar57 * 0.6931472;
                      fVar63 = auVar50._8_4_ - fVar59 * 0.6931472;
                      fVar64 = auVar50._12_4_ - fVar60 * 0.6931472;
                      auVar65._0_4_ =
                           (float)((int)fVar55 * 0x800000 + (int)fVar41) *
                           (fVar61 + fVar41 +
                           (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) *
                              fVar61 + 0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) *
                           fVar61 * fVar61) + fVar41;
                      auVar65._4_4_ =
                           (float)((int)fVar57 * 0x800000 + (int)fVar42) *
                           (fVar62 + fVar42 +
                           (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) *
                              fVar62 + 0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) *
                           fVar62 * fVar62) + fVar42;
                      auVar65._8_4_ =
                           (float)((int)fVar59 * 0x800000 + (int)fVar43) *
                           (fVar63 + fVar43 +
                           (((((fVar63 * 0.00019875691 + 0.0013981999) * fVar63 + 0.008333452) *
                              fVar63 + 0.041665796) * fVar63 + 0.16666666) * fVar63 + 0.5) *
                           fVar63 * fVar63) + fVar43;
                      auVar65._12_4_ =
                           (float)((int)fVar60 * 0x800000 + (int)fVar44) *
                           (fVar64 + fVar44 +
                           (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) *
                              fVar64 + 0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) *
                           fVar64 * fVar64) + fVar44;
                      auVar50 = maxps(auVar65,_DAT_0054e2d0);
                      fVar61 = (float)(auVar50._0_4_ & 0x807fffff | 0x3f000000);
                      fVar63 = (float)(auVar50._4_4_ & 0x807fffff | 0x3f000000);
                      fVar55 = (float)(auVar50._8_4_ & 0x807fffff | 0x3f000000);
                      fVar59 = (float)(auVar50._12_4_ & 0x807fffff | 0x3f000000);
                      fVar62 = fVar61 + -1.0 + (float)(-(uint)(fVar61 < 0.70710677) & (uint)fVar61);
                      fVar64 = fVar63 + -1.0 + (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar63);
                      fVar57 = fVar55 + -1.0 + (float)(-(uint)(fVar55 < 0.70710677) & (uint)fVar55);
                      fVar60 = fVar59 + -1.0 + (float)(-(uint)(fVar59 < 0.70710677) & (uint)fVar59);
                      auVar46._0_8_ =
                           CONCAT44(-(uint)(auVar65._4_4_ <= 0.0),-(uint)(auVar65._0_4_ <= 0.0)) &
                           0x7fffffff7fffffff;
                      auVar46._8_4_ = -(uint)(auVar65._8_4_ <= 0.0) & 0x7fffffff;
                      auVar46._12_4_ = -(uint)(auVar65._12_4_ <= 0.0) & 0x7fffffff;
                      auVar54._4_4_ =
                           ~-(uint)(auVar65._4_4_ <= 0.0) &
                           (uint)((((float)(int)((auVar50._4_4_ >> 0x17) - 0x7e) -
                                   (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar42)) * 0.6931472
                                   + fVar64 +
                                  (((((((((fVar64 * 0.070376836 + -0.1151461) * fVar64 + 0.116769984
                                         ) * fVar64 + -0.12420141) * fVar64 + 0.14249323) * fVar64 +
                                      -0.16668057) * fVar64 + 0.20000714) * fVar64 + -0.24999994) *
                                    fVar64 + 0.3333333) * fVar64 + -0.5) * fVar64 * fVar64) * -2.0);
                      auVar54._0_4_ =
                           ~-(uint)(auVar65._0_4_ <= 0.0) &
                           (uint)((((float)(int)((auVar50._0_4_ >> 0x17) - 0x7e) -
                                   (float)(-(uint)(fVar61 < 0.70710677) & (uint)fVar41)) * 0.6931472
                                   + fVar62 +
                                  (((((((((fVar62 * 0.070376836 + -0.1151461) * fVar62 + 0.116769984
                                         ) * fVar62 + -0.12420141) * fVar62 + 0.14249323) * fVar62 +
                                      -0.16668057) * fVar62 + 0.20000714) * fVar62 + -0.24999994) *
                                    fVar62 + 0.3333333) * fVar62 + -0.5) * fVar62 * fVar62) * -2.0);
                      auVar54._8_4_ =
                           ~-(uint)(auVar65._8_4_ <= 0.0) &
                           (uint)((((float)(int)((auVar50._8_4_ >> 0x17) - 0x7e) -
                                   (float)(-(uint)(fVar55 < 0.70710677) & (uint)fVar43)) * 0.6931472
                                   + fVar57 +
                                  (((((((((fVar57 * 0.070376836 + -0.1151461) * fVar57 + 0.116769984
                                         ) * fVar57 + -0.12420141) * fVar57 + 0.14249323) * fVar57 +
                                      -0.16668057) * fVar57 + 0.20000714) * fVar57 + -0.24999994) *
                                    fVar57 + 0.3333333) * fVar57 + -0.5) * fVar57 * fVar57) * -2.0);
                      auVar54._12_4_ =
                           ~-(uint)(auVar65._12_4_ <= 0.0) &
                           (uint)((((float)(int)((auVar50._12_4_ >> 0x17) - 0x7e) -
                                   (float)(-(uint)(fVar59 < 0.70710677) & (uint)fVar44)) * 0.6931472
                                   + fVar60 +
                                  (((((((((fVar60 * 0.070376836 + -0.1151461) * fVar60 + 0.116769984
                                         ) * fVar60 + -0.12420141) * fVar60 + 0.14249323) * fVar60 +
                                      -0.16668057) * fVar60 + 0.20000714) * fVar60 + -0.24999994) *
                                    fVar60 + 0.3333333) * fVar60 + -0.5) * fVar60 * fVar60) * -2.0);
                      auVar50 = minps(auVar46 | auVar54,auVar21);
                      auVar50 = maxps(auVar50,auVar22);
                      fVar61 = auVar50._0_4_ * 1.442695 + 0.5;
                      fVar62 = auVar50._4_4_ * 1.442695 + 0.5;
                      fVar63 = auVar50._8_4_ * 1.442695 + 0.5;
                      fVar64 = auVar50._12_4_ * 1.442695 + 0.5;
                      fVar55 = (float)(int)fVar61;
                      fVar57 = (float)(int)fVar62;
                      fVar59 = (float)(int)fVar63;
                      fVar60 = (float)(int)fVar64;
                      fVar55 = fVar55 - (float)(-(uint)(fVar61 < fVar55) & (uint)fVar41);
                      fVar57 = fVar57 - (float)(-(uint)(fVar62 < fVar57) & (uint)fVar42);
                      fVar59 = fVar59 - (float)(-(uint)(fVar63 < fVar59) & (uint)fVar43);
                      fVar60 = fVar60 - (float)(-(uint)(fVar64 < fVar60) & (uint)fVar44);
                      fVar61 = auVar50._0_4_ - fVar55 * 0.6931472;
                      fVar62 = auVar50._4_4_ - fVar57 * 0.6931472;
                      fVar63 = auVar50._8_4_ - fVar59 * 0.6931472;
                      fVar64 = auVar50._12_4_ - fVar60 * 0.6931472;
                      auVar47._0_4_ =
                           fVar61 + fVar41 +
                           (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) *
                              fVar61 + 0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) *
                           fVar61 * fVar61;
                      auVar47._4_4_ =
                           fVar62 + fVar42 +
                           (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) *
                              fVar62 + 0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) *
                           fVar62 * fVar62;
                      auVar47._8_4_ =
                           fVar63 + fVar43 +
                           (((((fVar63 * 0.00019875691 + 0.0013981999) * fVar63 + 0.008333452) *
                              fVar63 + 0.041665796) * fVar63 + 0.16666666) * fVar63 + 0.5) *
                           fVar63 * fVar63;
                      auVar47._12_4_ =
                           fVar64 + fVar44 +
                           (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) *
                              fVar64 + 0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) *
                           fVar64 * fVar64;
                      fVar55 = (float)((int)fVar55 * 0x800000 + (int)fVar41) * auVar47._0_4_ +
                               fVar41;
                      fVar57 = (float)((int)fVar57 * 0x800000 + (int)fVar42) * auVar47._4_4_ +
                               fVar42;
                      fVar59 = (float)((int)fVar59 * 0x800000 + (int)fVar43) * auVar47._8_4_ +
                               fVar43;
                      fVar60 = (float)((int)fVar60 * 0x800000 + (int)fVar44) * auVar47._12_4_ +
                               fVar44;
                      auVar11._4_4_ = fVar57;
                      auVar11._0_4_ = fVar55;
                      auVar11._8_4_ = fVar59;
                      auVar11._12_4_ = fVar60;
                      auVar50 = rcpps(auVar47,auVar11);
                      fVar61 = auVar50._0_4_;
                      fVar62 = auVar50._4_4_;
                      fVar63 = auVar50._8_4_;
                      fVar64 = auVar50._12_4_;
                      auVar50._0_4_ =
                           fVar45 * (fVar61 + fVar61 + -1.0 +
                                    (2.0 - fVar55 * (fVar61 + fVar61)) * fVar61);
                      auVar50._4_4_ =
                           fVar56 * (fVar62 + fVar62 + -1.0 +
                                    (2.0 - fVar57 * (fVar62 + fVar62)) * fVar62);
                      auVar50._8_4_ =
                           fVar52 * (fVar63 + fVar63 + -1.0 +
                                    (2.0 - fVar59 * (fVar63 + fVar63)) * fVar63);
                      auVar50._12_4_ =
                           fVar58 * (fVar64 + fVar64 + -1.0 +
                                    (2.0 - fVar60 * (fVar64 + fVar64)) * fVar64);
                      break;
                    case 6:
                      fVar61 = **(float **)(&this->field_0x118 + (long)p_Var4);
                      fVar62 = (*(float **)(&this->field_0x118 + (long)p_Var4))[1];
                      auVar51._0_4_ = fVar61 * fVar45 + fVar62;
                      auVar51._4_4_ = fVar61 * fVar56 + fVar62;
                      auVar51._8_4_ = fVar61 * fVar52 + fVar62;
                      auVar51._12_4_ = fVar61 * fVar58 + fVar62;
                      auVar50 = maxps(auVar51,ZEXT816(0));
                      auVar51 = minps(auVar50,auVar23);
                      auVar50._0_4_ = fVar45 * auVar51._0_4_;
                      auVar50._4_4_ = fVar56 * auVar51._4_4_;
                      auVar50._8_4_ = fVar52 * auVar51._8_4_;
                      auVar50._12_4_ = fVar58 * auVar51._12_4_;
                    }
                    *(undefined1 (*) [16])((long)pvVar33 + uVar32 * 0x10) = auVar50;
                    uVar32 = uVar32 + 1;
                  } while (uVar32 != _w);
                }
                pvVar33 = (void *)((long)pvVar33 + local_128 * 4);
                bVar40 = iVar37 != (int)local_1e0;
                iVar37 = iVar37 + 1;
              } while (bVar40);
            }
            local_138 = local_138 + 1;
            iVar25 = iVar25 + local_11c;
          } while (local_138 != local_130);
        }
        if (local_188.data != (void *)0x0) {
          operator_delete(local_188.data,
                          CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize) -
                          (long)local_188.data);
        }
      }
      iVar34 = 0;
      goto LAB_00437f67;
    }
  }
LAB_0043717f:
  uVar27 = iVar26 / iVar37;
  uVar28 = *(int *)(&this->field_0xd0 + (long)p_Var4) / iVar37;
  iVar29 = 1;
  local_268 = 1;
  if (opt->use_packing_layout == true) {
    iVar29 = (uint)((uVar27 & 3) == 0) * 3 + 1;
    local_268 = (uint)((uVar28 & 3) == 0) * 3 + 1;
  }
  piVar5 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
  local_188.data = local_1d8.data;
  local_188.refcount._0_4_ = local_1d8.refcount._0_4_;
  local_188.refcount._4_4_ = local_1d8.refcount._4_4_;
  local_188.elemsize._0_4_ = (undefined4)local_1d8.elemsize;
  local_188.elemsize._4_4_ = local_1d8.elemsize._4_4_;
  local_188.elempack = local_1d8.elempack;
  local_188.allocator = local_1d8.allocator;
  local_188.w = local_1d8.w;
  local_188.dims = local_1d8.dims;
  local_188.d = local_1d8.d;
  local_188.h = local_1d8.h;
  local_188.c = local_1d8.c;
  local_188.cstep = local_1d8.cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  if (iVar29 < iVar25) {
    local_238.data = *(void **)opt;
    uVar12 = opt->openmp_blocktime;
    uVar13 = opt->use_winograd_convolution;
    uVar15 = opt->use_sgemm_convolution;
    uVar17 = opt->use_int8_inference;
    uVar19 = opt->use_vulkan_compute;
    uVar18 = CONCAT11(uVar19,uVar17);
    uVar16 = CONCAT21(uVar18,uVar15);
    uVar14 = CONCAT31(uVar16,uVar13);
    local_238.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_238._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_238._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_238.c._0_1_ = opt->use_winograd43_convolution;
    local_238.c._1_1_ = opt->use_winograd63_convolution;
    local_238.c._2_1_ = opt->use_reserved_6;
    local_238.c._3_1_ = opt->use_reserved_7;
    local_238._60_1_ = opt->use_reserved_8;
    local_238._61_1_ = opt->use_reserved_9;
    local_238._62_1_ = opt->use_reserved_10;
    local_238._63_1_ = opt->use_reserved_11;
    local_238.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_238.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_238.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_238.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_238.elempack = uVar12;
    local_238._28_4_ = uVar14;
    convert_packing(&local_1d8,&local_188,iVar29,(Option *)&local_238);
  }
  local_238.data = pMVar20->data;
  piVar5 = pMVar20->refcount;
  local_238.refcount._0_4_ = SUB84(piVar5,0);
  local_238.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
  local_238.elemsize._0_4_ = (undefined4)pMVar20->elemsize;
  local_238.elemsize._4_4_ = (undefined4)(pMVar20->elemsize >> 0x20);
  local_238.elempack = pMVar20->elempack;
  local_238.allocator = pMVar20->allocator;
  local_238.dims = pMVar20->dims;
  local_238.w = pMVar20->w;
  local_238.h = pMVar20->h;
  local_238.d = pMVar20->d;
  local_238.c = pMVar20->c;
  local_238.cstep = pMVar20->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  if (local_268 < _elempack) {
    Mat::create(&local_238,_w,(int)local_128,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
                (int)local_268,(ulong)local_268 * ((ulong)_elemsize / (ulong)_elempack),local_268,
                opt->workspace_allocator);
    iVar34 = -100;
    if ((local_238.data != (void *)0x0) && ((long)local_238.c * local_238.cstep != 0))
    goto LAB_0043737f;
  }
  else {
LAB_0043737f:
    if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
      local_1e0 = CONCAT44(local_1e0._4_4_,(int)uVar27 / iVar29);
      iVar37 = 0;
      iVar25 = 0;
      lVar38 = 0;
      do {
        local_88 = CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
        local_c8 = (pointer)((long)(iVar37 / iVar29) * local_188.cstep * local_88 +
                            (long)local_188.data);
        lVar35 = (long)local_188.h;
        uStack_c0 = 0;
        uStack_bc = 0;
        local_b8 = (undefined4)local_188.elemsize;
        uStack_b4 = local_188.elemsize._4_4_;
        local_b0 = local_188.elempack;
        local_a8 = local_188.allocator;
        lVar30 = (long)local_188.d;
        uStack_98._0_4_ = local_188.h;
        uStack_98._4_4_ = local_188.d;
        local_90 = (int)local_1e0;
        local_88 = (lVar30 * local_88 * lVar35 * local_188.w + 0xf & 0xfffffffffffffff0) / local_88;
        local_a0._0_4_ = local_188.dims;
        local_a0._4_4_ = local_188.w;
        lVar35 = (long)local_238.h;
        local_d8 = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
        local_118 = (void *)((long)(iVar25 / (int)local_268) * local_238.cstep * local_d8 +
                            (long)local_238.data);
        uStack_110 = 0;
        uStack_10c = 0;
        local_108 = (undefined4)local_238.elemsize;
        uStack_104 = local_238.elemsize._4_4_;
        local_100 = local_238.elempack;
        local_f8 = local_238.allocator;
        lVar30 = (long)local_238.d;
        uStack_e8._0_4_ = local_238.h;
        uStack_e8._4_4_ = local_238.d;
        local_d8 = (lVar30 * local_d8 * lVar35 * local_238.w + 0xf & 0xfffffffffffffff0) / local_d8;
        local_f0._0_4_ = local_238.dims;
        local_f0._4_4_ = local_238.w;
        pLVar6 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar38];
        local_78 = *(undefined4 *)opt;
        iStack_74 = opt->num_threads;
        local_68 = *(undefined4 *)&opt->workspace_allocator;
        uStack_64 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        iStack_60 = opt->openmp_blocktime;
        uStack_5c._0_1_ = opt->use_winograd_convolution;
        uStack_5c._1_1_ = opt->use_sgemm_convolution;
        uStack_5c._2_1_ = opt->use_int8_inference;
        uStack_5c._3_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        local_58._4_1_ = opt->use_int8_packed;
        local_58._5_1_ = opt->use_int8_storage;
        local_58._6_1_ = opt->use_int8_arithmetic;
        local_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_reserved_0;
        local_48 = opt->flush_denormals;
        uStack_44._0_1_ = opt->use_local_pool_allocator;
        uStack_44._1_1_ = opt->use_shader_local_memory;
        uStack_44._2_1_ = opt->use_cooperative_matrix;
        uStack_44._3_1_ = opt->use_winograd23_convolution;
        uStack_40._0_1_ = opt->use_winograd43_convolution;
        uStack_40._1_1_ = opt->use_winograd63_convolution;
        uStack_40._2_1_ = opt->use_reserved_6;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_3c._0_1_ = opt->use_reserved_8;
        uStack_3c._1_1_ = opt->use_reserved_9;
        uStack_3c._2_1_ = opt->use_reserved_10;
        uStack_3c._3_1_ = opt->use_reserved_11;
        pAStack_70 = local_238.allocator;
        local_e0 = (int)uVar28 / (int)local_268;
        (*pLVar6->_vptr_Layer[7])(pLVar6,&local_c8,&local_118);
        piVar5 = (int *)CONCAT44(uStack_10c,uStack_110);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_f8 == (Allocator *)0x0) {
              if (local_118 != (void *)0x0) {
                free(local_118);
              }
            }
            else {
              (*local_f8->_vptr_Allocator[3])();
            }
          }
        }
        local_d8 = 0;
        local_118 = (void *)0x0;
        uStack_110 = 0;
        uStack_10c = 0;
        local_108 = 0;
        uStack_104 = 0;
        local_100 = 0;
        local_f0 = 0;
        uStack_e8 = 0;
        local_e0 = 0;
        piVar5 = (int *)CONCAT44(uStack_bc,uStack_c0);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_a8 == (Allocator *)0x0) {
              if (local_c8 != (pointer)0x0) {
                free(local_c8);
              }
            }
            else {
              (*local_a8->_vptr_Allocator[3])();
            }
          }
        }
        local_88 = 0;
        local_c8 = (pointer)0x0;
        uStack_c0 = 0;
        uStack_bc = 0;
        local_b8 = 0;
        uStack_b4 = 0;
        local_b0 = 0;
        local_a0 = 0;
        uStack_98 = 0;
        local_90 = 0;
        lVar38 = lVar38 + 1;
        iVar25 = iVar25 + uVar28;
        iVar37 = iVar37 + uVar27;
      } while (lVar38 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                ));
    }
    pMVar20 = local_1e8;
    if (local_268 < _elempack) {
      convert_packing(&local_238,local_1e8,_elempack,opt);
      iVar34 = 0;
    }
    else {
      iVar34 = 0;
      if (&local_238 != local_1e8) {
        piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = local_1e8->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_1e8->allocator == (Allocator *)0x0) {
              if (local_1e8->data != (void *)0x0) {
                free(local_1e8->data);
              }
            }
            else {
              (*local_1e8->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar34 = 0;
        pMVar20->cstep = 0;
        pMVar20->data = (void *)0x0;
        pMVar20->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar20->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar20->elemsize + 4) = 0;
        pMVar20->dims = 0;
        pMVar20->w = 0;
        pMVar20->h = 0;
        pMVar20->d = 0;
        pMVar20->c = 0;
        pMVar20->data = local_238.data;
        pMVar20->refcount = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        pMVar20->elemsize = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
        pMVar20->elempack = local_238.elempack;
        pMVar20->allocator = local_238.allocator;
        pMVar20->dims = local_238.dims;
        pMVar20->w = local_238.w;
        pMVar20->h = local_238.h;
        pMVar20->d = local_238.d;
        pMVar20->c = local_238.c;
        pMVar20->cstep = local_238.cstep;
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_238.cstep = 0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize._0_4_ = 0;
  local_238.elemsize._4_4_ = 0;
  local_238.elempack = 0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238._56_8_ = local_238._56_8_ & 0xffffffff00000000;
  piVar5 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        if (local_188.data != (void *)0x0) {
          free(local_188.data);
        }
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_188.cstep = 0;
  local_188.data = (void *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.elemsize._0_4_ = 0;
  local_188.elemsize._4_4_ = 0;
  local_188.elempack = 0;
  local_188.dims = 0;
  local_188.w = 0;
  local_188.h = 0;
  local_188.d = 0;
  local_188.c = 0;
LAB_00437f67:
  piVar5 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_1d8.allocator == (Allocator *)0x0) {
        if (local_1d8.data != (void *)0x0) {
          free(local_1d8.data);
        }
      }
      else {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar34;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}